

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O1

gui_view * __thiscall
boost::ext::di::v1_3_0::core::successful::
provider<boost::ext::di::v1_3_0::aux::pair<gui_view,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/tutorial/basic_first_steps_with_multiple_bindings.cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
::get<boost::ext::di::v1_3_0::type_traits::heap>
          (provider<boost::ext::di::v1_3_0::aux::pair<gui_view,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_multiple_bindings_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
           *this,heap *memory)

{
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_multiple_bindings_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *piVar1;
  renderer *prVar2;
  int iVar3;
  gui_view *pgVar4;
  
  piVar1 = this->injector_;
  pgVar4 = (gui_view *)operator_new(8);
  if ((scopes::singleton::
       scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
       create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
       ::object == '\0') &&
     (iVar3 = __cxa_guard_acquire(&scopes::singleton::
                                   scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                   ::
                                   create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                   ::object), iVar3 != 0)) {
    scopes::singleton::
    scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
    create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
    ::object = (renderer *)operator_new(4);
    scopes::singleton::
    scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
    create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
    ::object->device =
         (piVar1->
         super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_multiple_bindings_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
         ).
         super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         .super_scope<int,_int,_int>.object_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<renderer*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00106120,
               scopes::singleton::
               scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
               create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
               ::object);
    __cxa_atexit(std::__shared_ptr<renderer,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                 &scopes::singleton::
                  scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                  create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                  ::object,&__dso_handle);
    __cxa_guard_release(&scopes::singleton::
                         scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                         ::
                         create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                         ::object);
  }
  prVar2 = scopes::singleton::
           scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
           create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::e...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
           ::object;
  (pgVar4->super_iview)._vptr_iview = (_func_int **)&PTR__iview_00105bc0;
  if (prVar2->device != 0x2a) {
    __assert_fail("42 == r.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/tutorial/basic_first_steps_with_multiple_bindings.cpp"
                  ,0x1e,"gui_view::gui_view(std::string, const renderer &)");
  }
  return pgVar4;
}

Assistant:

auto& cfg() const { return ((injector__<TInjector>*)injector_)->cfg(); }